

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

void __thiscall
ncnn::Mat::to_pixels_resize
          (Mat *this,uchar *pixels,int type,int target_width,int target_height,int target_stride)

{
  int _w;
  int _h;
  int iVar1;
  Mat src;
  
  _w = this->w;
  _h = this->h;
  if (_h == target_height && _w == target_width) {
    to_pixels(this,pixels,type);
    return;
  }
  iVar1 = type >> 0x10;
  if ((uint)type < 0x10000) {
    iVar1 = type;
  }
  if (iVar1 - 1U < 2) {
    Mat(&src,_w,_h,3,3,(Allocator *)0x0);
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c3((uchar *)src.data,this->w,this->h,this->w * 3,pixels,target_width,
                       target_height,target_stride);
  }
  else if (iVar1 == 4) {
    Mat(&src,_w,_h,4,4,(Allocator *)0x0);
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c4((uchar *)src.data,this->w,this->h,this->w * 4,pixels,target_width,
                       target_height,target_stride);
  }
  else {
    if (iVar1 != 3) {
      return;
    }
    Mat(&src,_w,_h,1,1,(Allocator *)0x0);
    to_pixels(this,(uchar *)src.data,type);
    resize_bilinear_c1((uchar *)src.data,this->w,this->h,this->w,pixels,target_width,target_height,
                       target_stride);
  }
  ~Mat(&src);
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height, int target_stride) const
{
    if (w == target_width && h == target_height)
        return to_pixels(pixels, type);

    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        Mat src(w, h, (size_t)3u, 3);

        to_pixels(src, type);

        resize_bilinear_c3(src, w, h, w * 3, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_GRAY)
    {
        Mat src(w, h, (size_t)1u, 1);

        to_pixels(src, type);

        resize_bilinear_c1(src, w, h, w * 1, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_RGBA)
    {
        Mat src(w, h, (size_t)4u, 4);

        to_pixels(src, type);

        resize_bilinear_c4(src, w, h, w * 4, pixels, target_width, target_height, target_stride);
    }
}